

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-backend.cpp
# Opt level: O0

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,int n_tokens)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  ggml_cgraph *pgVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  const_reference pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float fVar16;
  ggml_tensor *inpFF;
  ggml_tensor *KQV_merged;
  ggml_tensor *KQV;
  ggml_tensor *V_trans;
  ggml_tensor *KQ_soft_max;
  ggml_tensor *KQ_masked;
  ggml_tensor *KQ_scaled;
  ggml_tensor *KQ;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *cur;
  int il;
  ggml_tensor *inpL;
  ggml_tensor *position;
  ggml_tensor *embd;
  ggml_cgraph *gf;
  ggml_context *ctx;
  ggml_init_params params;
  int n_head;
  int n_ctx;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams;
  int N;
  allocator_type *in_stack_fffffffffffffd30;
  size_type in_stack_fffffffffffffd38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd40;
  int local_9c;
  undefined8 local_98;
  
  iVar1 = *(int *)(in_RDI + 8);
  iVar2 = *(int *)(in_RDI + 0x10);
  iVar3 = *(int *)(in_RDI + 4);
  iVar4 = *(int *)(in_RDI + 0xc);
  if (gpt2_graph(gpt2_model_const&,int,int)::buf_size == '\0') {
    iVar5 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,int)::buf_size);
    if (iVar5 != 0) {
      lVar6 = ggml_tensor_overhead();
      lVar7 = ggml_graph_overhead_custom(0x1000,0);
      gpt2_graph::buf_size = lVar6 * 0x1000 + lVar7;
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,int)::buf_size);
    }
  }
  if (gpt2_graph(gpt2_model_const&,int,int)::buf == '\0') {
    iVar5 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,int)::buf);
    if (iVar5 != 0) {
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1141fe);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x114229);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &gpt2_graph::buf,&__dso_handle);
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,int)::buf);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11426a);
  uVar8 = ggml_init();
  pgVar9 = (ggml_cgraph *)ggml_new_graph_custom(uVar8,0x1000,0);
  uVar10 = ggml_new_tensor_1d(uVar8,0x1a,(long)in_EDX);
  ggml_set_name(uVar10,"embd");
  ggml_set_input(uVar10);
  uVar11 = ggml_new_tensor_1d(uVar8,0x1a,(long)in_EDX);
  ggml_set_name(uVar11,"position");
  ggml_set_input(uVar11);
  uVar10 = ggml_get_rows(uVar8,*(undefined8 *)(in_RDI + 0x30),uVar10);
  uVar11 = ggml_get_rows(uVar8,*(undefined8 *)(in_RDI + 0x38),uVar11);
  local_98 = ggml_add(uVar8,uVar10,uVar11);
  for (local_9c = 0; local_9c < iVar2; local_9c = local_9c + 1) {
    uVar10 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar8,local_98);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar10 = ggml_mul(uVar8,uVar10,pvVar12->ln_1_g);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar10 = ggml_add(uVar8,uVar10,pvVar12->ln_1_b);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar10 = ggml_mul_mat(uVar8,pvVar12->c_attn_attn_w,uVar10);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    lVar6 = ggml_add(uVar8,uVar10,pvVar12->c_attn_attn_b);
    uVar10 = ggml_view_2d(uVar8,lVar6,(long)iVar1,(long)in_EDX,*(undefined8 *)(lVar6 + 0x38),0);
    uVar11 = ggml_view_2d(uVar8,lVar6,(long)iVar1,(long)in_EDX,*(undefined8 *)(lVar6 + 0x38),
                          (long)iVar1 << 2);
    uVar13 = ggml_view_2d(uVar8,lVar6,(long)iVar1,(long)in_EDX,*(undefined8 *)(lVar6 + 0x38),
                          (long)iVar1 << 3);
    if (0 < in_EDX) {
      uVar15 = *(undefined8 *)(in_RDI + 0x60);
      lVar6 = ggml_element_size(*(undefined8 *)(in_RDI + 0x60));
      uVar14 = ggml_view_1d(uVar8,uVar15,(long)(in_EDX * iVar1),
                            lVar6 * iVar1 * (long)(local_9c * iVar3 + in_ESI));
      uVar15 = *(undefined8 *)(in_RDI + 0x68);
      lVar6 = ggml_element_size(*(undefined8 *)(in_RDI + 0x68));
      uVar15 = ggml_view_1d(uVar8,uVar15,(long)(in_EDX * iVar1),
                            lVar6 * iVar1 * (long)(local_9c * iVar3 + in_ESI));
      uVar11 = ggml_cpy(uVar8,uVar11,uVar14);
      ggml_build_forward_expand(pgVar9,uVar11);
      uVar11 = ggml_cpy(uVar8,uVar13,uVar15);
      ggml_build_forward_expand(pgVar9,uVar11);
    }
    uVar11 = uVar8;
    uVar10 = ggml_cont_3d(uVar8,uVar10,(long)(iVar1 / iVar4),(long)iVar4,(long)in_EDX);
    uVar11 = ggml_permute(uVar11,uVar10,0,2,1,3);
    uVar10 = *(undefined8 *)(in_RDI + 0x60);
    lVar6 = ggml_element_size(*(undefined8 *)(in_RDI + 0x60));
    uVar10 = ggml_view_1d(uVar8,uVar10,(long)((in_ESI + in_EDX) * iVar1),
                          (local_9c * iVar3) * lVar6 * (long)iVar1);
    uVar10 = ggml_reshape_3d(uVar8,uVar10,(long)(iVar1 / iVar4),(long)iVar4,(long)(in_ESI + in_EDX))
    ;
    uVar10 = ggml_permute(uVar8,uVar10,0,2,1,3);
    uVar10 = ggml_mul_mat(uVar8,uVar10,uVar11);
    fVar16 = sqrtf((float)iVar1 / (float)iVar4);
    uVar10 = ggml_scale(1.0 / fVar16,uVar8,uVar10);
    uVar10 = ggml_diag_mask_inf(uVar8,uVar10,in_ESI);
    uVar11 = ggml_soft_max(uVar8,uVar10);
    uVar10 = *(undefined8 *)(in_RDI + 0x68);
    lVar6 = ggml_element_size(*(undefined8 *)(in_RDI + 0x68));
    uVar10 = ggml_view_1d(uVar8,uVar10,(long)((in_ESI + in_EDX) * iVar1),
                          (local_9c * iVar3) * lVar6 * (long)iVar1);
    uVar10 = ggml_reshape_3d(uVar8,uVar10,(long)(iVar1 / iVar4),(long)iVar4,(long)(in_ESI + in_EDX))
    ;
    uVar10 = ggml_permute(uVar8,uVar10,1,2,0,3);
    uVar10 = ggml_cont_3d(uVar8,uVar10,(long)(in_ESI + in_EDX),(long)(iVar1 / iVar4),(long)iVar4);
    uVar10 = ggml_mul_mat(uVar8,uVar10,uVar11);
    uVar10 = ggml_permute(uVar8,uVar10,0,2,1,3);
    uVar10 = ggml_cont_2d(uVar8,uVar10,(long)iVar1,(long)in_EDX);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar10 = ggml_mul_mat(uVar8,pvVar12->c_attn_proj_w,uVar10);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar10 = ggml_add(uVar8,uVar10,pvVar12->c_attn_proj_b);
    uVar10 = ggml_add(uVar8,uVar10,local_98);
    uVar11 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar8,uVar10);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar11 = ggml_mul(uVar8,uVar11,pvVar12->ln_2_g);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar11 = ggml_add(uVar8,uVar11,pvVar12->ln_2_b);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar11 = ggml_mul_mat(uVar8,pvVar12->c_mlp_fc_w,uVar11);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar11 = ggml_add(uVar8,uVar11,pvVar12->c_mlp_fc_b);
    uVar11 = ggml_gelu(uVar8,uVar11);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar11 = ggml_mul_mat(uVar8,pvVar12->c_mlp_proj_w,uVar11);
    pvVar12 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_9c);
    uVar11 = ggml_add(uVar8,uVar11,pvVar12->c_mlp_proj_b);
    local_98 = ggml_add(uVar8,uVar11,uVar10);
  }
  uVar11 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar8,local_98);
  uVar10 = uVar8;
  uVar11 = ggml_mul(uVar8,uVar11,*(undefined8 *)(in_RDI + 0x20));
  uVar10 = ggml_add(uVar10,uVar11,*(undefined8 *)(in_RDI + 0x28));
  uVar10 = ggml_mul_mat(uVar8,*(undefined8 *)(in_RDI + 0x40),uVar10);
  ggml_set_name(uVar10,"logits");
  ggml_set_output(uVar10);
  ggml_build_forward_expand(pgVar9,uVar10);
  ggml_free(uVar8);
  return pgVar9;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const int n_tokens) {
    const int N = n_tokens;

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, N);
    // at this point, the tensor data is not allocated yet and cannot be set
    // we will find the tensor after the graph is allocated by its name, and set the data then
    ggml_set_name(embd, "embd");
    // setting a tensor as an input will ensure that it is allocated at the beginning of the graph
    // this is important to ensure that the input tensors are not overwritten before they are used
    ggml_set_input(embd);

    struct ggml_tensor * position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, N);
    ggml_set_name(position, "position");
    ggml_set_input(position);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled =
                ggml_scale(ctx,
                        KQ,
                        1.0f/sqrtf(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_set_name(inpL, "logits");
    // setting a tensor as the output will ensure that it is not overwritten by subsequent operations
    ggml_set_output(inpL);

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}